

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

char * rlogin_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int iVar1;
  undefined8 *__s;
  Conf *pCVar2;
  char *pcVar3;
  SockAddr *addr_00;
  Socket *pSVar4;
  char *colon;
  char *loghost;
  int addressfamily;
  Rlogin *rlogin;
  char *err;
  SockAddr *addr;
  _Bool keepalive_local;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *vt_local;
  
  __s = (undefined8 *)safemalloc(1,0x80,0);
  memset(__s,0,0x80);
  __s[10] = &Rlogin_plugvt;
  __s[0xb] = vt;
  __s[0xd] = &Rlogin_interactorvt;
  __s[0xc] = __s + 0xd;
  *__s = 0;
  *(undefined1 *)(__s + 1) = 0;
  __s[4] = seat;
  __s[5] = logctx;
  iVar1 = conf_get_int(conf,0x7d);
  *(int *)((long)__s + 0x14) = iVar1;
  iVar1 = conf_get_int(conf,0x7e);
  *(int *)(__s + 3) = iVar1;
  *(undefined1 *)(__s + 2) = 0;
  *(undefined1 *)((long)__s + 0x11) = 1;
  *(undefined1 *)((long)__s + 0x12) = 0;
  __s[9] = 0;
  pCVar2 = conf_copy(conf);
  __s[8] = pCVar2;
  pcVar3 = default_description(vt,host,port);
  __s[7] = pcVar3;
  *backend_handle = (Backend *)(__s + 0xb);
  iVar1 = conf_get_int(conf,3);
  addr_00 = name_lookup(host,port,realhost,conf,iVar1,(LogContext *)__s[5],"rlogin connection");
  pcVar3 = sk_addr_error(addr_00);
  if (pcVar3 == (char *)0x0) {
    if (port < 0) {
      port = 0x201;
    }
    pSVar4 = new_connection(addr_00,*realhost,port,true,false,nodelay,keepalive,(Plug *)(__s + 10),
                            conf,(Interactor *)(__s + 0xd));
    *__s = pSVar4;
    pcVar3 = sk_socket_error((Socket *)*__s);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = conf_get_str(conf,9);
      if (*pcVar3 != '\0') {
        safefree(*realhost);
        pcVar3 = dupstr(pcVar3);
        *realhost = pcVar3;
        pcVar3 = host_strrchr(*realhost,0x3a);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\0';
        }
      }
      vt_local = (BackendVtable *)0x0;
    }
    else {
      vt_local = (BackendVtable *)dupstr(pcVar3);
    }
  }
  else {
    sk_addr_free(addr_00);
    vt_local = (BackendVtable *)dupstr(pcVar3);
  }
  return (char *)vt_local;
}

Assistant:

static char *rlogin_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Rlogin *rlogin;
    int addressfamily;
    char *loghost;

    rlogin = snew(Rlogin);
    memset(rlogin, 0, sizeof(Rlogin));
    rlogin->plug.vt = &Rlogin_plugvt;
    rlogin->backend.vt = vt;
    rlogin->interactor.vt = &Rlogin_interactorvt;
    rlogin->backend.interactor = &rlogin->interactor;
    rlogin->s = NULL;
    rlogin->closed_on_socket_error = false;
    rlogin->seat = seat;
    rlogin->logctx = logctx;
    rlogin->term_width = conf_get_int(conf, CONF_width);
    rlogin->term_height = conf_get_int(conf, CONF_height);
    rlogin->socket_connected = false;
    rlogin->firstbyte = true;
    rlogin->cansize = false;
    rlogin->prompt = NULL;
    rlogin->conf = conf_copy(conf);
    rlogin->description = default_description(vt, host, port);
    *backend_handle = &rlogin->backend;

    addressfamily = conf_get_int(conf, CONF_addressfamily);
    /*
     * Try to find host.
     */
    addr = name_lookup(host, port, realhost, conf, addressfamily,
                       rlogin->logctx, "rlogin connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 513;                    /* default rlogin port */

    /*
     * Open socket.
     */
    rlogin->s = new_connection(addr, *realhost, port, true, false,
                               nodelay, keepalive, &rlogin->plug, conf,
                               &rlogin->interactor);
    if ((err = sk_socket_error(rlogin->s)) != NULL)
        return dupstr(err);

    loghost = conf_get_str(conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}